

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O1

BOOL __thiscall
Js::HeapArgumentsObject::IsFormalArgument
          (HeapArgumentsObject *this,PropertyId propertyId,uint32 *pIndex)

{
  BOOL BVar1;
  uint uVar2;
  
  BVar1 = ScriptContext::IsNumericPropertyId
                    ((((((this->super_ArgumentsObject).super_DynamicObject.super_RecyclableObject.
                         type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                     scriptContext.ptr,propertyId,pIndex);
  if (BVar1 == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = (uint)(*pIndex < this->formalCount &&
                  *pIndex < (*(uint *)&this->field_0x20 & 0x7fffffff));
  }
  return uVar2;
}

Assistant:

BOOL HeapArgumentsObject::IsFormalArgument(PropertyId propertyId, uint32* pIndex)
    {
        return
            this->GetScriptContext()->IsNumericPropertyId(propertyId, pIndex) &&
            IsFormalArgument(*pIndex);
    }